

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgitems.cpp
# Opt level: O1

void __thiscall icu_63::NativeItem::setItem(NativeItem *this,Item *item,UDataSwapFn *swap)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  UErrorCode code;
  Item *pIVar5;
  UBool UVar6;
  uint uVar7;
  UDataInfo *pUVar8;
  UDataSwapper *pUVar9;
  uint8_t *puVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  undefined8 uVar14;
  uint extraout_EDX;
  void *inData;
  UErrorCode *pErrorCode;
  uint uVar15;
  UErrorCode errorCode;
  int32_t itemHeaderLength;
  int32_t infoLength;
  char acStack_9c [4];
  ulong uStack_98;
  ulong uStack_90;
  ulong uStack_88;
  ulong uStack_80;
  ulong uStack_78;
  UChar UStack_70;
  ushort uStack_6e;
  ushort uStack_6c;
  ushort uStack_6a;
  NativeItem *pNStack_68;
  UErrorCode *pUStack_60;
  UErrorCode local_2c;
  int local_28;
  int32_t local_24;
  
  this->pItem = item;
  local_2c = U_ZERO_ERROR;
  pUVar8 = getDataInfo(item->data,item->length,&local_24,&local_28,&local_2c);
  this->pInfo = pUVar8;
  if (U_ZERO_ERROR < local_2c) {
    exit(local_2c);
  }
  this->length = this->pItem->length - local_28;
  if ((pUVar8->isBigEndian == '\0') && (pUVar8->charsetFamily == '\0')) {
    this->bytes = this->pItem->data + local_28;
  }
  else {
    uVar14 = 0;
    pErrorCode = &local_2c;
    pUVar9 = udata_openSwapper_63(pUVar8->isBigEndian,pUVar8->charsetFamily,'\0','\0',&local_2c);
    inData = (void *)(ulong)(uint)local_2c;
    if (U_ZERO_ERROR < local_2c) {
      pUVar9 = (UDataSwapper *)this;
      setItem();
      if (((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) &&
         (pNStack_68 = this, pUStack_60 = &local_2c,
         udata_swapDataHeader_63(pUVar9,inData,-1,(void *)0x0,pErrorCode),
         *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
        UStack_70 = (UChar)*(byte *)((long)inData + 0xc);
        uStack_6e = (ushort)*(byte *)((long)inData + 0xd);
        uStack_6c = (ushort)*(byte *)((long)inData + 0xe);
        uStack_6a = (ushort)*(byte *)((long)inData + 0xf);
        UVar6 = uprv_isInvariantUString_63(&UStack_70,4);
        if (UVar6 == '\0') {
          builtin_strncpy(acStack_9c,"????",4);
        }
        else {
          u_UCharsToChars_63(&UStack_70,acStack_9c,4);
        }
        lVar11 = 0;
        do {
          if (*(int *)(swapFns[0].dataFormat + lVar11) == *(int *)((long)inData + 0xc)) {
            uVar7 = (**(code **)(swapFns[0].dataFormat + lVar11 + 8))
                              (pUVar9,inData,extraout_EDX,uVar14,pErrorCode);
            code = *pErrorCode;
            if (U_ZERO_ERROR < code) {
              bVar1 = *(byte *)((long)inData + 0xc);
              bVar2 = *(byte *)((long)inData + 0xd);
              bVar3 = *(byte *)((long)inData + 0xe);
              bVar4 = *(byte *)((long)inData + 0xf);
              uStack_80 = (ulong)(uint)(int)acStack_9c[0];
              uStack_88 = (ulong)(uint)(int)acStack_9c[1];
              uStack_90 = (ulong)(uint)(int)acStack_9c[2];
              uStack_98 = (ulong)(uint)(int)acStack_9c[3];
              pcVar12 = u_errorName_63(code);
              udata_printError_63(pUVar9,
                                  "udata_swap(): failure swapping data format %02x.%02x.%02x.%02x (\"%c%c%c%c\") - %s\n"
                                  ,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4,uStack_80,
                                  uStack_88,uStack_90,uStack_98,pcVar12);
              return;
            }
            if ((int)(extraout_EDX - 0xf) <= (int)uVar7) {
              return;
            }
            bVar1 = *(byte *)((long)inData + 0xc);
            bVar2 = *(byte *)((long)inData + 0xd);
            uStack_80 = (ulong)*(byte *)((long)inData + 0xe);
            uStack_88 = (ulong)*(byte *)((long)inData + 0xf);
            uStack_90 = (ulong)(uint)(int)acStack_9c[0];
            uStack_98 = (ulong)(uint)(int)acStack_9c[1];
            uStack_78 = (ulong)(uint)(int)acStack_9c[2];
            uVar15 = (uint)acStack_9c[3];
            pcVar12 = u_errorName_63(code);
            udata_printError_63(pUVar9,
                                "udata_swap() warning: swapped only %d out of %d bytes - data format %02x.%02x.%02x.%02x (\"%c%c%c%c\")\n"
                                ,(ulong)uVar7,(ulong)extraout_EDX,(ulong)bVar1,(ulong)bVar2,
                                uStack_80,uStack_88,uStack_90,uStack_98,uStack_78,(ulong)uVar15,
                                pcVar12);
            return;
          }
          lVar11 = lVar11 + 0x10;
        } while (lVar11 != 0x110);
        udata_printError_63(pUVar9,
                            "udata_swap(): unknown data format %02x.%02x.%02x.%02x (\"%c%c%c%c\")\n"
                            ,(ulong)*(byte *)((long)inData + 0xc),
                            (ulong)*(byte *)((long)inData + 0xd),
                            (ulong)*(byte *)((long)inData + 0xe),
                            (ulong)*(byte *)((long)inData + 0xf),(ulong)(uint)(int)acStack_9c[0],
                            (ulong)(uint)(int)acStack_9c[1],(ulong)(uint)(int)acStack_9c[2],
                            (ulong)(uint)(int)acStack_9c[3]);
        *pErrorCode = U_UNSUPPORTED_ERROR;
      }
      return;
    }
    pUVar9->printError = printError;
    pUVar9->printErrorContext = _stderr;
    pIVar5 = this->pItem;
    iVar13 = -1;
    if (-1 < pIVar5->length) {
      iVar13 = pIVar5->length;
    }
    puVar10 = (uint8_t *)operator_new__((long)iVar13);
    this->swapped = puVar10;
    (*swap)(pUVar9,pIVar5->data,pIVar5->length,puVar10,&local_2c);
    pUVar8 = getDataInfo(this->swapped,this->pItem->length,&local_24,&local_28,&local_2c);
    this->pInfo = pUVar8;
    this->bytes = this->swapped + local_28;
    udata_closeSwapper_63(pUVar9);
  }
  return;
}

Assistant:

void setItem(const Item *item, UDataSwapFn *swap) {
        pItem=item;
        int32_t infoLength, itemHeaderLength;
        UErrorCode errorCode=U_ZERO_ERROR;
        pInfo=::getDataInfo(pItem->data, pItem->length, infoLength, itemHeaderLength, &errorCode);
        if(U_FAILURE(errorCode)) {
            exit(errorCode); // should succeed because readFile() checks headers
        }
        length=pItem->length-itemHeaderLength;

        if(pInfo->isBigEndian==U_IS_BIG_ENDIAN && pInfo->charsetFamily==U_CHARSET_FAMILY) {
            bytes=pItem->data+itemHeaderLength;
        } else {
            UDataSwapper *ds=udata_openSwapper((UBool)pInfo->isBigEndian, pInfo->charsetFamily, U_IS_BIG_ENDIAN, U_CHARSET_FAMILY, &errorCode);
            if(U_FAILURE(errorCode)) {
                fprintf(stderr, "icupkg: udata_openSwapper(\"%s\") failed - %s\n",
                        pItem->name, u_errorName(errorCode));
                exit(errorCode);
            }

            ds->printError=printError;
            ds->printErrorContext=stderr;

            swapped=new uint8_t[pItem->length];
            if(swapped==NULL) {
                fprintf(stderr, "icupkg: unable to allocate memory for swapping \"%s\"\n", pItem->name);
                exit(U_MEMORY_ALLOCATION_ERROR);
            }
            swap(ds, pItem->data, pItem->length, swapped, &errorCode);
            pInfo=::getDataInfo(swapped, pItem->length, infoLength, itemHeaderLength, &errorCode);
            bytes=swapped+itemHeaderLength;
            udata_closeSwapper(ds);
        }
    }